

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

void EnumStr(node *p,array *List)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (p != (node *)0x0) {
    sVar2 = StrTab_Size((strtab *)(*p->VMT + 0x130));
    List->_Begin = (char *)0x0;
    List->_Used = 0;
    ArrayResize(List,sVar2 * 8,0);
    pcVar1 = List->_Begin;
    for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
      *(size_t *)(pcVar1 + sVar3 * 8) = sVar3 + 0x100;
    }
    return;
  }
  __assert_fail("(const void*)(p)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                ,0x474,"void EnumStr(node *, array *)");
}

Assistant:

static void EnumStr(node *p,array* List)
{
    dataid Id,*i;
    size_t StrSize = StrTab_Size(&Parser_Context(p)->StrTab);

    ArrayInit(List);
    ArrayResize(List,StrSize*sizeof(dataid),0);
    i = ARRAYBEGIN(*List,dataid);
    for (Id = 0;Id < StrSize;++Id,++i)
        *i = Id+LANG_STRINGS_OFFSET;
}